

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedCharException.cpp
# Opt level: O0

string * __thiscall
antlr::MismatchedCharException::getMessage_abi_cxx11_(MismatchedCharException *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  long in_RSI;
  string *in_RDI;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> elems;
  string *s;
  ANTLRException *in_stack_fffffffffffffb18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *this_00;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [36];
  uint local_40c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_408;
  undefined1 local_3e9 [33];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  uVar2 = (ulong)(*(int *)(in_RSI + 0x50) - 1);
  switch(uVar2) {
  case 0:
    charName_abi_cxx11_(0);
    iVar3 = (int)(uVar2 >> 0x20);
    std::operator+((char *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    charName_abi_cxx11_(iVar3);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    std::__cxx11::string::operator+=((string *)this_00,local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    break;
  case 1:
    charName_abi_cxx11_(0);
    std::operator+((char *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    std::__cxx11::string::operator+=((string *)this_00,local_108);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    break;
  case 2:
    charName_abi_cxx11_(0);
    iVar3 = (int)(uVar2 >> 0x20);
    std::operator+((char *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    charName_abi_cxx11_(iVar3);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    charName_abi_cxx11_(iVar3);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    std::__cxx11::string::operator+=((string *)this_00,local_168);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_228);
    break;
  case 3:
    charName_abi_cxx11_(0);
    iVar3 = (int)(uVar2 >> 0x20);
    std::operator+((char *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    charName_abi_cxx11_(iVar3);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    charName_abi_cxx11_(iVar3);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    std::__cxx11::string::operator+=((string *)this_00,local_288);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_388);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_368);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::~string(local_348);
    break;
  case 4:
  case 5:
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
               (allocator<char> *)in_stack_fffffffffffffb50);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffb20);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffb20);
    std::__cxx11::string::operator+=((string *)this_00,local_3a8);
    std::__cxx11::string::~string(local_3a8);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string((string *)(local_3e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3e9);
    BitSet::toArray((BitSet *)in_stack_fffffffffffffb58);
    local_40c = 0;
    while( true ) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_40c;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_408);
      if (pbVar1 <= __rhs) break;
      std::__cxx11::string::operator+=((string *)this_00," \'");
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (&local_408,(ulong)local_40c);
      charName_abi_cxx11_((int)(uVar2 >> 0x20));
      std::__cxx11::string::operator+=((string *)this_00,local_430);
      std::__cxx11::string::~string(local_430);
      std::__cxx11::string::operator+=((string *)this_00,"\'");
      local_40c = local_40c + 1;
    }
    charName_abi_cxx11_((int)(uVar2 >> 0x20));
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::operator+=((string *)this_00,local_450);
    std::__cxx11::string::~string(local_450);
    std::__cxx11::string::~string(local_470);
    std::__cxx11::string::~string(local_490);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    break;
  default:
    ANTLRException::getMessage_abi_cxx11_(in_stack_fffffffffffffb18);
    std::__cxx11::string::operator+=((string *)this_00,(string *)&stack0xfffffffffffffb50);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffb50);
  }
  return in_RDI;
}

Assistant:

string MismatchedCharException::getMessage() const
{
	ANTLR_USE_NAMESPACE(std)string s;

	switch (mismatchType) {
	case CHAR :
		s += "expecting '" + charName(expecting) + "', found '" + charName(foundChar) + "'";
		break;
	case NOT_CHAR :
		s += "expecting anything but '" + charName(expecting) + "'; got it anyway";
		break;
	case RANGE :
		s += "expecting token in range: '" + charName(expecting) + "'..'" + charName(upper) + "', found '" + charName(foundChar) + "'";
		break;
	case NOT_RANGE :
		s += "expecting token NOT in range: " + charName(expecting) + "'..'" + charName(upper) + "', found '" + charName(foundChar) + "'";
		break;
	case SET :
	case NOT_SET :
		{
			s += ANTLR_USE_NAMESPACE(std)string("expecting ") + (mismatchType == NOT_SET ? "NOT " : "") + "one of (";
			ANTLR_USE_NAMESPACE(std)vector<unsigned int> elems = set.toArray();
			for ( unsigned int i = 0; i < elems.size(); i++ )
			{
				s += " '";
				s += charName(elems[i]);
				s += "'";
			}
			s += "), found '" + charName(foundChar) + "'";
		}
		break;
	default :
		s += RecognitionException::getMessage();
		break;
	}

	return s;
}